

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Dropout::forward_impl
          (Dropout *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  Tensor m;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffef8;
  Tensor *in_stack_ffffffffffffff10;
  Tensor *in_stack_ffffffffffffff18;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff20;
  real in_stack_ffffffffffffff28;
  real in_stack_ffffffffffffff2c;
  Tensor *in_stack_ffffffffffffff30;
  Dim local_60 [2];
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  local_10 = in_RSI;
  Tensor::Tensor(in_stack_ffffffffffffff10,local_60,(float *)in_RDI);
  TensorTools::RandomBernoulli
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,0);
  Tensor::vec(in_stack_ffffffffffffff18);
  Tensor::vec(in_stack_ffffffffffffff18);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
  cwiseProduct<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20);
  Tensor::vec(in_stack_ffffffffffffff18);
  Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
            (in_RDI,in_stack_fffffffffffffef8);
  Tensor::~Tensor((Tensor *)0x60b1be);
  return;
}

Assistant:

void Dropout::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  Tensor m(dim, (float*)aux_mem);
  TensorTools::RandomBernoulli(m, (1.f-p), 1.f / (1.f-p));
#ifdef HAVE_CUDA
  gpu::vcwise_product(fx.d.size(), xs[0]->v, m.v, fx.v);
#else
  fx.vec() = xs[0]->vec().cwiseProduct(m.vec());
#endif
}